

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O0

void __thiscall wasm::OptimizeAddedConstants::createHelperIndexes(OptimizeAddedConstants *this)

{
  Function *pFVar1;
  PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
  *this_00;
  undefined1 local_f8 [8];
  Creator creator;
  OptimizeAddedConstants *this_local;
  
  creator.module = (Module *)this;
  createHelperIndexes()::Creator::Creator(std::map<wasm::LocalSet*,unsigned_int,std::less<wasm::
  LocalSet*>,std::allocator<std::pair<wasm::LocalSet__const_unsigned_int>_>_>__
            ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)local_f8,&this->helperIndexes);
  this_00 = &(this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
  ;
  creator.helperIndexes =
       (map<wasm::LocalSet_*,_unsigned_int,_std::less<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_int>_>_>
        *)Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
          ::getModule(&this_00->
                       super_Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
                     );
  pFVar1 = Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
           ::getFunction(&this_00->
                          super_Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
                        );
  Walker<Creator,_wasm::Visitor<Creator,_void>_>::walk
            ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)local_f8,&pFVar1->body);
  createHelperIndexes::Creator::~Creator((Creator *)local_f8);
  return;
}

Assistant:

void createHelperIndexes() {
    struct Creator : public PostWalker<Creator> {
      std::map<LocalSet*, Index>& helperIndexes;
      Module* module;

      Creator(std::map<LocalSet*, Index>& helperIndexes)
        : helperIndexes(helperIndexes) {}

      void visitLocalSet(LocalSet* curr) {
        auto iter = helperIndexes.find(curr);
        if (iter != helperIndexes.end()) {
          auto index = iter->second;
          auto* binary = curr->value->cast<Binary>();
          Expression** target;
          if (binary->left->is<Const>()) {
            target = &binary->right;
          } else {
            assert(binary->right->is<Const>());
            target = &binary->left;
          }
          auto* value = *target;
          Builder builder(*module);
          *target = builder.makeLocalGet(index, Type::i32);
          replaceCurrent(
            builder.makeSequence(builder.makeLocalSet(index, value), curr));
        }
      }
    } creator(helperIndexes);
    creator.module = getModule();
    creator.walk(getFunction()->body);
  }